

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlloader.c
# Opt level: O2

void * CMdlsym(void *vdlh,char *sym)

{
  size_t sVar1;
  size_t sVar2;
  char *__dest;
  void *pvVar3;
  char *pcVar4;
  
  sVar1 = strlen(sym);
  pcVar4 = *(char **)((long)vdlh + 8);
  sVar2 = strlen(pcVar4);
  __dest = (char *)malloc(sVar1 + sVar2 + 3);
  strcpy(__dest,pcVar4);
  strcat(__dest,sym);
  pvVar3 = (void *)dlsym(*vdlh,__dest);
  if (pvVar3 == (void *)0x0) {
    sVar1 = strlen(__dest);
    pcVar4 = (char *)malloc(sVar1 + 4);
    builtin_strncpy(pcVar4,"lib",4);
    strcat(pcVar4,__dest);
    pvVar3 = (void *)dlsym(*vdlh,pcVar4);
    free(pcVar4);
  }
  free(__dest);
  if (pvVar3 != (void *)0x0) {
    return pvVar3;
  }
  pvVar3 = (void *)dlsym(*vdlh,sym);
  return pvVar3;
}

Assistant:

void*
CMdlsym(void *vdlh, char *sym)
{
#if NO_DYNAMIC_LINKING
    return NULL;
#else
    dlhandle dlh = (dlhandle)vdlh;
    char *tmp = malloc(strlen(sym) + strlen(dlh->lib_prefix) + 3);
    void *sym_val;
    strcpy(tmp, dlh->lib_prefix);
    strcat(tmp, sym);
    sym_val = dlsym(dlh->dlopen_handle, tmp);
    if (!sym_val) {
      // try with lib prefix
      char *tmp2 = malloc(strlen(tmp) + 4);
      strcpy(tmp2, "lib");
      strcat(tmp2, tmp);
      sym_val = dlsym(dlh->dlopen_handle, tmp2);
      free(tmp2);
    }
    free(tmp);
    if (!sym_val) 
	sym_val = dlsym(dlh->dlopen_handle, sym);
    return sym_val;
#endif
}